

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O1

int av1_optimize_b(AV1_COMP *cpi,MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type,
                  TXB_CTX *txb_ctx,int *rate_cost)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = x->plane[plane].eobs[block];
  uVar2 = (uint)uVar1;
  if (((uVar1 == 0) ||
      (uVar3 = *(ushort *)&(*(x->e_mbd).mi)->field_0xa7 & 7, cpi->optimize_seg_arr[uVar3] == '\0'))
     || ((x->e_mbd).lossless[uVar3] != 0)) {
    *rate_cost = (x->coeff_costs).coeff_costs[(uint)""[tx_size] + (uint)""[tx_size] + 1 >> 1 & 0xff]
                 [plane != 0].txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  }
  else {
    uVar2 = av1_optimize_txb(cpi,x,plane,block,tx_size,tx_type,txb_ctx,rate_cost,
                             (cpi->oxcf).algo_cfg.sharpness);
  }
  return uVar2;
}

Assistant:

int av1_optimize_b(const struct AV1_COMP *cpi, MACROBLOCK *x, int plane,
                   int block, TX_SIZE tx_size, TX_TYPE tx_type,
                   const TXB_CTX *const txb_ctx, int *rate_cost) {
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *const p = &x->plane[plane];
  const int eob = p->eobs[block];
  const int segment_id = xd->mi[0]->segment_id;

  if (eob == 0 || !cpi->optimize_seg_arr[segment_id] ||
      xd->lossless[segment_id]) {
    *rate_cost = av1_cost_skip_txb(&x->coeff_costs, txb_ctx, plane, tx_size);
    return eob;
  }

  return av1_optimize_txb(cpi, x, plane, block, tx_size, tx_type, txb_ctx,
                          rate_cost, cpi->oxcf.algo_cfg.sharpness);
}